

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects.h
# Opt level: O1

bool __thiscall wasm::EffectAnalyzer::hasNonTrapSideEffects(EffectAnalyzer *this)

{
  bool bVar1;
  
  bVar1 = true;
  if ((((((this->localsWritten)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) &&
        (this->danglingPop == false)) &&
       ((this->globalsWritten)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)) &&
      (((this->writesMemory == false && (this->writesTable == false)) &&
       ((this->writesStruct == false && ((this->writesArray == false && (this->isAtomic == false))))
       )))) && ((this->calls == false &&
                ((((this->throws_ == false &&
                   ((this->delegateTargets)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0))
                  && (this->branchesOut == false)) &&
                 ((this->breakTargets)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)))))) {
    bVar1 = this->mayNotReturn;
  }
  return bVar1;
}

Assistant:

bool hasNonTrapSideEffects() const {
    return localsWritten.size() > 0 || danglingPop || writesGlobalState() ||
           throws() || transfersControlFlow() || mayNotReturn;
  }